

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::saveModel(FastText *this)

{
  element_type *peVar1;
  pointer pcVar2;
  char cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream ofs;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (peVar1->output)._M_dataplus._M_p;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,pcVar2,pcVar2 + (peVar1->output)._M_string_length);
  std::__cxx11::string::append((char *)local_238);
  std::ofstream::ofstream(&local_218,(string *)local_238,_S_bin);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0]);
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    Args::save((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ostream *)&local_218);
    Dictionary::save((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ostream *)&local_218);
    Matrix::save((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ostream *)&local_218);
    Matrix::save((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ostream *)&local_218);
    std::ofstream::close();
    local_218 = _VTT;
    *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_210);
    std::ios_base::~ios_base(local_120);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Model file cannot be opened for saving!",0x27);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(1);
}

Assistant:

void FastText::saveModel() {
  std::ofstream ofs(args_->output + ".bin", std::ofstream::binary);
  if (!ofs.is_open()) {
    std::cerr << "Model file cannot be opened for saving!" << std::endl;
    exit(EXIT_FAILURE);
  }
  args_->save(ofs);
  dict_->save(ofs);
  input_->save(ofs);
  output_->save(ofs);
  ofs.close();
}